

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.cpp
# Opt level: O1

void duckdb::UnsupportedEquiWidth(DataChunk *args,ExpressionState *state,Vector *param_3)

{
  Expression *expr;
  BinderException *this;
  reference pvVar1;
  LogicalType local_60;
  string local_48;
  
  this = (BinderException *)__cxa_allocate_exception(0x10);
  expr = state->expr;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Unsupported type \"%s\" for equi_width_bins","");
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  LogicalType::LogicalType(&local_60,&pvVar1->type);
  BinderException::BinderException<duckdb::LogicalType>(this,expr,&local_48,&local_60);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void UnsupportedEquiWidth(DataChunk &args, ExpressionState &state, Vector &) {
	throw BinderException(state.expr, "Unsupported type \"%s\" for equi_width_bins", args.data[0].GetType());
}